

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamIndexFactory_p.cpp
# Opt level: O1

BamIndex *
BamTools::Internal::BamIndexFactory::CreateIndexOfType(IndexType *type,BamReaderPrivate *reader)

{
  BamToolsIndex *this;
  
  if (*type == BAMTOOLS) {
    this = (BamToolsIndex *)operator_new(0x68);
    BamToolsIndex::BamToolsIndex(this,reader);
  }
  else if (*type == STANDARD) {
    this = (BamToolsIndex *)operator_new(0x68);
    BamStandardIndex::BamStandardIndex((BamStandardIndex *)this,reader);
  }
  else {
    this = (BamToolsIndex *)0x0;
  }
  return &this->super_BamIndex;
}

Assistant:

BamIndex* BamIndexFactory::CreateIndexOfType(const BamIndex::IndexType& type,
                                             BamReaderPrivate* reader)
{
    switch (type) {
        case (BamIndex::STANDARD):
            return new BamStandardIndex(reader);
        case (BamIndex::BAMTOOLS):
            return new BamToolsIndex(reader);
        default:
            return 0;
    }
}